

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  long lVar260;
  int iVar261;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  ulong uVar279;
  ulong uVar280;
  ulong uVar281;
  ulong uVar282;
  uint64_t uVar283;
  ulong uVar284;
  ulong uVar285;
  ulong uVar286;
  ulong uVar287;
  uint64_t uVar288;
  ulong uVar289;
  ulong uVar290;
  ulong uVar291;
  uint64_t uVar292;
  ulong uVar293;
  ulong uVar294;
  ulong uVar295;
  long lVar296;
  uint64_t uVar297;
  ulong uVar298;
  ulong uVar299;
  ulong uVar300;
  ulong uVar301;
  ulong uVar302;
  ulong uVar303;
  ulong uVar304;
  ulong uVar305;
  ulong uVar306;
  
  r->infinity = a->infinity;
  secp256k1_fe_impl_mul(&r->z,&a->z,&a->y);
  uVar300 = (a->y).n[0];
  uVar281 = (a->y).n[1];
  uVar282 = (a->y).n[3];
  uVar301 = uVar300 * 2;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar282;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar301;
  uVar284 = (a->y).n[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar284;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar281 * 2;
  uVar285 = (a->y).n[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar285;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar285;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SUB168(auVar4 * auVar150,0);
  auVar5 = auVar3 * auVar149 + auVar2 * auVar148 + auVar5 * ZEXT816(0x1000003d10);
  uVar285 = uVar285 * 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar285;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar300;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar282;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar281 * 2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar284;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar284;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar4 * auVar150,8);
  auVar2 = auVar9 * ZEXT816(0x1000003d10000) +
           auVar6 * auVar151 + auVar8 * auVar153 + auVar7 * auVar152 + (auVar5 >> 0x34);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar300;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar300;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar285;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar281;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar282;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar284 * 2;
  auVar3 = auVar12 * auVar156 + auVar11 * auVar155 + (auVar2 >> 0x34);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
  auVar6 = auVar13 * ZEXT816(0x1000003d1) + auVar10 * auVar154;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar281;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar301;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar285;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar284;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar282;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar282;
  auVar3 = auVar16 * auVar159 + auVar15 * auVar158 + (auVar3 >> 0x34);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
  auVar4 = (auVar6 >> 0x34) + auVar14 * auVar157 + auVar17 * ZEXT816(0x1000003d10);
  uVar279 = auVar4._0_8_;
  uVar300 = auVar4._8_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar284;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar301;
  auVar258._8_8_ = uVar300 >> 0x34;
  auVar258._0_8_ = uVar300 * 0x1000 | uVar279 >> 0x34;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar281;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar281;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar285;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar282;
  auVar3 = auVar20 * auVar162 + (auVar3 >> 0x34);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar3._0_8_;
  auVar258 = auVar21 * ZEXT816(0x1000003d10) + auVar19 * auVar161 + auVar18 * auVar160 + auVar258;
  auVar4 = auVar258 >> 0x34;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = auVar4._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar3._8_8_;
  auVar264._8_8_ = auVar4._8_8_;
  auVar264._0_8_ = auVar5._0_8_ & 0xffffffffffffe;
  auVar265 = auVar22 * ZEXT816(0x1000003d10000) + auVar264 + auVar265;
  uVar280 = auVar265._0_8_;
  uVar300 = (a->x).n[0];
  uVar281 = (a->x).n[3];
  uVar294 = uVar300 * 2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar281;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar294;
  uVar282 = (a->x).n[1];
  uVar284 = (a->x).n[2];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar284;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar282 * 2;
  uVar301 = (auVar265._8_8_ << 0xc | uVar280 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
  uVar285 = (a->x).n[4];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar285;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar285;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = SUB168(auVar25 * auVar165,0);
  auVar2 = auVar24 * auVar164 + auVar23 * auVar163 + auVar26 * ZEXT816(0x1000003d10);
  uVar293 = uVar285 * 2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar293;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar300;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar281;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar282 * 2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar284;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar284;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = SUB168(auVar25 * auVar165,8);
  auVar3 = auVar30 * ZEXT816(0x1000003d10000) +
           auVar27 * auVar166 + auVar29 * auVar168 + auVar28 * auVar167 + (auVar2 >> 0x34);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar300;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar300;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar293;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar282;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar281;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar284 * 2;
  auVar4 = auVar33 * auVar171 + auVar32 * auVar170 + (auVar3 >> 0x34);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar3._6_2_ & 0xf);
  auVar5 = auVar34 * ZEXT816(0x1000003d1) + auVar31 * auVar169;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar282;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar294;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar293;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar284;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar281;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar281;
  auVar4 = auVar37 * auVar174 + auVar36 * auVar173 + (auVar4 >> 0x34);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
  auVar7 = (auVar5 >> 0x34) + auVar38 * ZEXT816(0x1000003d10) + auVar35 * auVar172;
  uVar305 = auVar7._0_8_;
  uVar289 = auVar7._8_8_;
  auVar259._8_8_ = uVar289 >> 0x34;
  auVar259._0_8_ = uVar289 * 0x1000 | uVar305 >> 0x34;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar284;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar294;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar282;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar282;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar293;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar281;
  auVar4 = auVar41 * auVar177 + (auVar4 >> 0x34);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar4._0_8_;
  auVar259 = auVar42 * ZEXT816(0x1000003d10) + auVar40 * auVar176 + auVar39 * auVar175 + auVar259;
  auVar7 = auVar259 >> 0x34;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = auVar7._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar4._8_8_;
  auVar266._8_8_ = auVar7._8_8_;
  auVar266._0_8_ = auVar2._0_8_ & 0xffffffffffffe;
  auVar267 = auVar43 * ZEXT816(0x1000003d10000) + auVar266 + auVar267;
  uVar293 = auVar267._0_8_;
  lVar296 = (auVar5._0_8_ & 0xfffffffffffff) * 3;
  uVar294 = -(ulong)((uint)lVar296 & 1);
  uVar298 = (uVar294 >> 0x10) +
            ((auVar267._8_8_ << 0xc | uVar293 >> 0x34) + (auVar3._0_8_ & 0xffffffffffff)) * 3;
  uVar294 = uVar294 >> 0xc;
  lVar260 = (uVar305 & 0xfffffffffffff) * 3;
  iVar261 = (int)uVar294;
  uVar295 = ((ulong)(iVar261 + (int)lVar260 & 1) << 0x33) +
            ((uVar294 & 0xffffefffffc2f) + lVar296 >> 1);
  lVar296 = (auVar259._0_8_ & 0xfffffffffffff) * 3;
  uVar286 = ((ulong)((int)lVar296 + iVar261 & 1) << 0x33) + (lVar260 + uVar294 >> 1);
  lVar260 = (uVar293 & 0xfffffffffffff) * 3;
  uVar291 = ((ulong)((int)lVar260 + iVar261 & 1) << 0x33) + (lVar296 + uVar294 >> 1);
  uVar293 = ((ulong)((uint)uVar298 & 1) << 0x33) + (uVar294 + lVar260 >> 1);
  uVar299 = uVar298 >> 1;
  uVar289 = auVar6._0_8_ & 0xfffffffffffff;
  uVar290 = 0x3ffffbfffff0bc - uVar289;
  uVar279 = uVar279 & 0xfffffffffffff;
  uVar304 = 0x3ffffffffffffc - uVar279;
  uVar305 = auVar258._0_8_ & 0xfffffffffffff;
  uVar302 = 0x3ffffffffffffc - uVar305;
  uVar280 = uVar280 & 0xfffffffffffff;
  uVar287 = 0x3ffffffffffffc - uVar280;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar290;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar281;
  uVar306 = 0x3fffffffffffc - uVar301;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar304;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar284;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar302;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar282;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar287;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar300;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar306;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar285;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = SUB168(auVar48 * auVar182,0);
  auVar2 = auVar49 * ZEXT816(0x1000003d10) +
           auVar45 * auVar179 + auVar44 * auVar178 + auVar46 * auVar180 + auVar47 * auVar181;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar290;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar285;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar304;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar281;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar302;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar284;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar287;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar282;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar306;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar300;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = SUB168(auVar48 * auVar182,8);
  auVar3 = auVar55 * ZEXT816(0x1000003d10000) +
           auVar54 * auVar187 +
           auVar53 * auVar186 + auVar52 * auVar185 + auVar51 * auVar184 + auVar50 * auVar183 +
           (auVar2 >> 0x34);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar290;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar300;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar304;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar285;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar302;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar281;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar287;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar284;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar306;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar282;
  auVar4 = auVar60 * auVar192 + auVar59 * auVar191 + auVar58 * auVar190 + auVar57 * auVar189 +
           (auVar3 >> 0x34);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar3._6_2_ & 0xf);
  auVar5 = auVar56 * auVar188 + auVar61 * ZEXT816(0x1000003d1);
  uVar294 = auVar5._0_8_;
  uVar303 = auVar5._8_8_;
  auVar262._8_8_ = uVar303 >> 0x34;
  auVar262._0_8_ = uVar303 * 0x1000 | uVar294 >> 0x34;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar290;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar282;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar304;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar300;
  uVar294 = uVar294 & 0xfffffffffffff;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar302;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar285;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar287;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar281;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar306;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar284;
  auVar4 = auVar66 * auVar197 + auVar65 * auVar196 + auVar64 * auVar195 + (auVar4 >> 0x34);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
  auVar262 = auVar67 * ZEXT816(0x1000003d10) + auVar63 * auVar194 + auVar62 * auVar193 + auVar262;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar290;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar284;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar304;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar282;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar302;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar300;
  uVar290 = auVar262._0_8_ & 0xfffffffffffff;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar287;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar285;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar306;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar281;
  auVar4 = auVar72 * auVar202 + auVar71 * auVar201 + (auVar4 >> 0x34);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = auVar4._0_8_;
  auVar5 = auVar73 * ZEXT816(0x1000003d10) +
           auVar70 * auVar200 + auVar69 * auVar199 + auVar68 * auVar198 + (auVar262 >> 0x34);
  auVar6 = auVar5 >> 0x34;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = auVar6._0_8_;
  uVar281 = auVar5._0_8_ & 0xfffffffffffff;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = auVar4._8_8_;
  auVar268._8_8_ = auVar6._8_8_;
  auVar268._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
  auVar269 = auVar74 * ZEXT816(0x1000003d10000) + auVar268 + auVar269;
  uVar282 = auVar269._0_8_;
  lVar296 = (auVar269._8_8_ << 0xc | uVar282 >> 0x34) + (auVar3._0_8_ & 0xffffffffffff);
  uVar282 = uVar282 & 0xfffffffffffff;
  uVar300 = uVar295 * 2;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar293;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar300;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar291;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar286 * 2;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar299;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar299;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = SUB168(auVar77 * auVar205,0);
  auVar2 = auVar78 * ZEXT816(0x1000003d10) + auVar76 * auVar204 + auVar75 * auVar203;
  uVar298 = uVar298 & 0xfffffffffffffffe;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar298;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar295;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar293;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar286 * 2;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar291;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar291;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = SUB168(auVar77 * auVar205,8);
  auVar3 = auVar82 * ZEXT816(0x1000003d10000) +
           auVar80 * auVar207 + auVar81 * auVar208 + auVar79 * auVar206 + (auVar2 >> 0x34);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar295;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar295;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar298;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar286;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar293;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar291 * 2;
  auVar4 = auVar85 * auVar211 + auVar84 * auVar210 + (auVar3 >> 0x34);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar3._6_2_ & 0xf);
  auVar5 = auVar86 * ZEXT816(0x1000003d1) + auVar83 * auVar209;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar286;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar300;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar291;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar298;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar293;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar293;
  auVar6 = auVar89 * auVar214 + auVar88 * auVar213 + (auVar4 >> 0x34);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar4 = auVar90 * ZEXT816(0x1000003d10) + auVar87 * auVar212 + (auVar5 >> 0x34);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar291;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar300;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar286;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar286;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar293;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar298;
  auVar6 = auVar93 * auVar217 + (auVar6 >> 0x34);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = auVar6._0_8_;
  auVar7 = auVar94 * ZEXT816(0x1000003d10) + auVar92 * auVar216 + auVar91 * auVar215 +
           (auVar4 >> 0x34);
  auVar8 = auVar7 >> 0x34;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = auVar8._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = auVar6._8_8_;
  auVar270._8_8_ = auVar8._8_8_;
  auVar270._0_8_ = auVar2._0_8_ & 0xffffffffffffe;
  auVar271 = auVar95 * ZEXT816(0x1000003d10000) + auVar270 + auVar271;
  uVar300 = auVar271._0_8_;
  uVar283 = (auVar3._0_8_ & 0xffffffffffff) + lVar296 * 2 +
            (auVar271._8_8_ << 0xc | uVar300 >> 0x34);
  uVar1 = (auVar5._0_8_ & 0xfffffffffffff) + uVar294 * 2;
  uVar292 = (auVar4._0_8_ & 0xfffffffffffff) + uVar290 * 2;
  uVar297 = (auVar7._0_8_ & 0xfffffffffffff) + uVar281 * 2;
  uVar288 = (uVar300 & 0xfffffffffffff) + uVar282 * 2;
  uVar300 = uVar289 * 2;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar280;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar300;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar305;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar279 * 2;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar301;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar301;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = SUB168(auVar98 * auVar220,0);
  auVar2 = auVar97 * auVar219 + auVar96 * auVar218 + auVar99 * ZEXT816(0x1000003d10);
  uVar284 = auVar2._0_8_;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = auVar2._8_8_ << 0xc | uVar284 >> 0x34;
  uVar301 = uVar301 * 2;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar289;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar301;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar280;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar279 * 2;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar305;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar305;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = SUB168(auVar98 * auVar220,8);
  auVar272 = auVar103 * ZEXT816(0x1000003d10000) +
             auVar100 * auVar221 + auVar102 * auVar223 + auVar101 * auVar222 + auVar272;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar289;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar289;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar279;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar301;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar280;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar305 * 2;
  auVar2 = auVar106 * auVar226 + auVar105 * auVar225 + (auVar272 >> 0x34);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar272._6_2_ & 0xf);
  auVar3 = auVar107 * ZEXT816(0x1000003d1) + auVar104 * auVar224;
  uVar285 = auVar3._0_8_;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = auVar3._8_8_ << 0xc | uVar285 >> 0x34;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar279;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar300;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar305;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar301;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar280;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar280;
  auVar2 = auVar110 * auVar229 + auVar109 * auVar228 + (auVar2 >> 0x34);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
  auVar273 = auVar111 * ZEXT816(0x1000003d10) + auVar108 * auVar227 + auVar273;
  uVar289 = auVar273._0_8_;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = auVar273._8_8_ << 0xc | uVar289 >> 0x34;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar305;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar300;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar279;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar279;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar280;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar301;
  auVar2 = auVar114 * auVar232 + (auVar2 >> 0x34);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = auVar2._0_8_;
  auVar274 = auVar115 * ZEXT816(0x1000003d10) + auVar113 * auVar231 + auVar112 * auVar230 + auVar274
  ;
  auVar3 = auVar274 >> 0x34;
  auVar275._8_8_ = auVar3._8_8_;
  auVar275._0_8_ = uVar284 & 0xffffffffffffe;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = auVar3._0_8_;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = auVar2._8_8_;
  auVar276 = auVar116 * ZEXT816(0x1000003d10000) + auVar275 + auVar276;
  uVar301 = auVar276._0_8_;
  (r->x).n[0] = uVar1;
  uVar294 = uVar1 + uVar294;
  (r->x).n[1] = uVar292;
  uVar290 = uVar292 + uVar290;
  (r->x).n[2] = uVar297;
  uVar281 = uVar297 + uVar281;
  (r->x).n[3] = uVar288;
  uVar282 = uVar288 + uVar282;
  (r->x).n[4] = uVar283;
  uVar280 = uVar283 + lVar296;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar294;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar293;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar290;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar291;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar281;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar286;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar282;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar295;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar280;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar299;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = SUB168(auVar121 * auVar237,0);
  auVar5 = auVar118 * auVar234 + auVar117 * auVar233 + auVar119 * auVar235 + auVar120 * auVar236 +
           auVar122 * ZEXT816(0x1000003d10);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar294;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar299;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar290;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar293;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar281;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar291;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar282;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar286;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar280;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar295;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = SUB168(auVar121 * auVar237,8);
  auVar2 = auVar128 * ZEXT816(0x1000003d10000) +
           auVar127 * auVar242 +
           auVar126 * auVar241 + auVar125 * auVar240 + auVar124 * auVar239 + auVar123 * auVar238 +
           (auVar5 >> 0x34);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar294;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar295;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar290;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar299;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar281;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar293;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar282;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar291;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar280;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar286;
  auVar3 = auVar133 * auVar247 + auVar132 * auVar246 + auVar131 * auVar245 + auVar130 * auVar244 +
           (auVar2 >> 0x34);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
  auVar4 = auVar129 * auVar243 + auVar134 * ZEXT816(0x1000003d1);
  uVar300 = auVar4._0_8_;
  uVar279 = auVar4._8_8_;
  uVar284 = uVar300 & 0xfffffffffffff;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar294;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar286;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar290;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar295;
  auVar263._8_8_ = uVar279 >> 0x34;
  auVar263._0_8_ = uVar279 * 0x1000 | uVar300 >> 0x34;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar281;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar299;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar282;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar293;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar280;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar291;
  auVar3 = auVar139 * auVar252 + auVar138 * auVar251 + auVar137 * auVar250 + (auVar3 >> 0x34);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
  auVar263 = auVar140 * ZEXT816(0x1000003d10) + auVar135 * auVar248 + auVar136 * auVar249 + auVar263
  ;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar294;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar291;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar290;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar286;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar281;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar295;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar282;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar299;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar280;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar293;
  auVar3 = auVar145 * auVar257 + auVar144 * auVar256 + (auVar3 >> 0x34);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = auVar3._0_8_;
  auVar4 = auVar146 * ZEXT816(0x1000003d10) +
           auVar143 * auVar255 + auVar141 * auVar253 + auVar142 * auVar254 + (auVar263 >> 0x34);
  auVar6 = auVar4 >> 0x34;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = auVar6._0_8_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = auVar3._8_8_;
  auVar277._8_8_ = auVar6._8_8_;
  auVar277._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
  auVar278 = auVar147 * ZEXT816(0x1000003d10000) + auVar277 + auVar278;
  uVar300 = auVar278._0_8_;
  (r->y).n[0] = uVar284;
  (r->y).n[0] = 0x5ffff9ffffe91a - (uVar284 + (uVar285 & 0xfffffffffffff));
  (r->y).n[1] = 0x5ffffffffffffa -
                ((auVar263._0_8_ & 0xfffffffffffff) + (uVar289 & 0xfffffffffffff));
  (r->y).n[2] = 0x5ffffffffffffa -
                ((auVar4._0_8_ & 0xfffffffffffff) + (auVar274._0_8_ & 0xfffffffffffff));
  (r->y).n[3] = 0x5ffffffffffffa - ((uVar300 & 0xfffffffffffff) + (uVar301 & 0xfffffffffffff));
  (r->y).n[4] = 0x5fffffffffffa -
                ((auVar278._8_8_ << 0xc | uVar300 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff) +
                (auVar276._8_8_ << 0xc | uVar301 >> 0x34) + (auVar272._0_8_ & 0xffffffffffff));
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 8 add/half/mul_int/negate */
    secp256k1_fe l, s, t;
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;

    /* Formula used:
     * L = (3/2) * X1^2
     * S = Y1^2
     * T = -X1*S
     * X3 = L^2 + 2*T
     * Y3 = -(L*(X3 + T) + S^2)
     * Z3 = Y1*Z1
     */

    secp256k1_fe_mul(&r->z, &a->z, &a->y); /* Z3 = Y1*Z1 (1) */
    secp256k1_fe_sqr(&s, &a->y);           /* S = Y1^2 (1) */
    secp256k1_fe_sqr(&l, &a->x);           /* L = X1^2 (1) */
    secp256k1_fe_mul_int(&l, 3);           /* L = 3*X1^2 (3) */
    secp256k1_fe_half(&l);                 /* L = 3/2*X1^2 (2) */
    secp256k1_fe_negate(&t, &s, 1);        /* T = -S (2) */
    secp256k1_fe_mul(&t, &t, &a->x);       /* T = -X1*S (1) */
    secp256k1_fe_sqr(&r->x, &l);           /* X3 = L^2 (1) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + T (2) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + 2*T (3) */
    secp256k1_fe_sqr(&s, &s);              /* S' = S^2 (1) */
    secp256k1_fe_add(&t, &r->x);           /* T' = X3 + T (4) */
    secp256k1_fe_mul(&r->y, &t, &l);       /* Y3 = L*(X3 + T) (1) */
    secp256k1_fe_add(&r->y, &s);           /* Y3 = L*(X3 + T) + S^2 (2) */
    secp256k1_fe_negate(&r->y, &r->y, 2);  /* Y3 = -(L*(X3 + T) + S^2) (3) */

    SECP256K1_GEJ_VERIFY(r);
}